

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O2

ares_conn_err_t ares_socket_deref_error(int err)

{
  ares_conn_err_t aVar1;
  
  switch(err) {
  case 0x61:
    aVar1 = ARES_CONN_ERR_AFNOSUPPORT;
    break;
  case 99:
    return ARES_CONN_ERR_BADADDR;
  case 100:
    aVar1 = ARES_CONN_ERR_NETDOWN;
    break;
  case 0x65:
    aVar1 = ARES_CONN_ERR_NETUNREACH;
    break;
  case 0x67:
    aVar1 = ARES_CONN_ERR_CONNABORTED;
    break;
  case 0x68:
    aVar1 = ARES_CONN_ERR_CONNRESET;
    break;
  case 0x6e:
    aVar1 = ARES_CONN_ERR_CONNTIMEDOUT;
    break;
  case 0x6f:
    aVar1 = ARES_CONN_ERR_CONNREFUSED;
    break;
  case 0x70:
    aVar1 = ARES_CONN_ERR_HOSTDOWN;
    break;
  case 0x71:
    aVar1 = ARES_CONN_ERR_HOSTUNREACH;
    break;
  case 0x73:
    return ARES_CONN_ERR_WOULDBLOCK;
  default:
    if (err == 4) {
      return ARES_CONN_ERR_INTERRUPT;
    }
    if (err == 0xb) {
      return ARES_CONN_ERR_WOULDBLOCK;
    }
  case 0x62:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x72:
    aVar1 = ARES_CONN_ERR_FAILURE;
  }
  return aVar1;
}

Assistant:

static ares_conn_err_t ares_socket_deref_error(int err)
{
  switch (err) {
#if defined(EWOULDBLOCK)
    case EWOULDBLOCK:
      return ARES_CONN_ERR_WOULDBLOCK;
#endif
#if defined(EAGAIN) && (!defined(EWOULDBLOCK) || EAGAIN != EWOULDBLOCK)
    case EAGAIN:
      return ARES_CONN_ERR_WOULDBLOCK;
#endif
    case EINPROGRESS:
      return ARES_CONN_ERR_WOULDBLOCK;
    case ENETDOWN:
      return ARES_CONN_ERR_NETDOWN;
    case ENETUNREACH:
      return ARES_CONN_ERR_NETUNREACH;
    case ECONNABORTED:
      return ARES_CONN_ERR_CONNABORTED;
    case ECONNRESET:
      return ARES_CONN_ERR_CONNRESET;
    case ECONNREFUSED:
      return ARES_CONN_ERR_CONNREFUSED;
    case ETIMEDOUT:
      return ARES_CONN_ERR_CONNTIMEDOUT;
    case EHOSTDOWN:
      return ARES_CONN_ERR_HOSTDOWN;
    case EHOSTUNREACH:
      return ARES_CONN_ERR_HOSTUNREACH;
    case EINTR:
      return ARES_CONN_ERR_INTERRUPT;
    case EAFNOSUPPORT:
      return ARES_CONN_ERR_AFNOSUPPORT;
    case EADDRNOTAVAIL:
      return ARES_CONN_ERR_BADADDR;
    default:
      break;
  }

  return ARES_CONN_ERR_FAILURE;
}